

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O3

void print_ordinary(ostream *outstream,int min_dimension,int max_dimension,int top_dimension,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *number_of_cells,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *betti,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *skipped,
                   bool approximate_computation,bool with_cell_counts)

{
  int iVar1;
  char cVar2;
  ostream *poVar3;
  long *plVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  size_t idx;
  ulong uVar9;
  bool bVar10;
  
  cVar2 = (char)outstream;
  if (with_cell_counts) {
    std::__ostream_insert<char,std::char_traits<char>>
              (outstream,"# Cell counts (of dimensions between ",0x25);
    uVar5 = 1;
    if (1 < min_dimension) {
      uVar5 = min_dimension;
    }
    poVar3 = (ostream *)std::ostream::operator<<(outstream,uVar5 - 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," and ",5);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,top_dimension);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"):",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((int)(uVar5 - 1) <= top_dimension) {
      uVar9 = (ulong)uVar5 - 1;
      do {
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)outstream);
        pcVar7 = "";
        if ((long)uVar9 < (long)(ulong)(uint)top_dimension) {
          pcVar7 = " ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,pcVar7,(ulong)((long)uVar9 < (long)(ulong)(uint)top_dimension));
        uVar9 = uVar9 + 1;
      } while (top_dimension + 1 != uVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)outstream + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    if (top_dimension < 0) {
      iVar8 = 0;
    }
    else {
      uVar9 = 0;
      iVar8 = 0;
      do {
        iVar1 = (int)(number_of_cells->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
        iVar6 = -iVar1;
        if ((uVar9 & 1) == 0) {
          iVar6 = iVar1;
        }
        iVar8 = iVar8 + iVar6;
        uVar9 = uVar9 + 1;
      } while (top_dimension + 1 != uVar9);
    }
    if (max_dimension == 0xffff && min_dimension == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(outstream,"# Euler characteristic:",0x17);
      std::ios::widen((char)*(undefined8 *)(*(long *)outstream + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      plVar4 = (long *)std::ostream::operator<<(outstream,iVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
    }
  }
  if (approximate_computation) {
    std::__ostream_insert<char,std::char_traits<char>>
              (outstream,"# Skipped columns of the coboundary matrix (in dimensions between ",0x42);
    iVar8 = 1;
    if (1 < min_dimension) {
      iVar8 = min_dimension;
    }
    uVar9 = (ulong)(iVar8 - 1U);
    poVar3 = (ostream *)std::ostream::operator<<(outstream,iVar8 - 1U);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," and ",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"):",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (uVar9 < (ulong)((long)(skipped->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(skipped->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3)) {
      do {
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)outstream);
        bVar10 = uVar9 < (ulong)((long)(betti->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(betti->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 3);
        pcVar7 = "";
        if (bVar10) {
          pcVar7 = " ";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,(ulong)bVar10);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)(skipped->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(skipped->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)outstream + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(outstream,"# Betti numbers (between ",0x19);
  poVar3 = (ostream *)std::ostream::operator<<(outstream,min_dimension);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," and ",5);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"):",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  uVar9 = (ulong)min_dimension;
  if (uVar9 < (ulong)((long)(betti->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(betti->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3)) {
    do {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)outstream);
      bVar10 = uVar9 < (ulong)((long)(betti->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(betti->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3);
      pcVar7 = "";
      if (bVar10) {
        pcVar7 = " ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,(ulong)bVar10);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(betti->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(betti->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)outstream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void print_ordinary(std::ostream& outstream, int min_dimension, int max_dimension, int top_dimension,
                    std::vector<size_t> number_of_cells, std::vector<size_t> betti, std::vector<size_t> skipped,
                    bool approximate_computation, bool with_cell_counts) {
	if (with_cell_counts) {
		outstream << "# Cell counts (of dimensions between " << std::max(0, min_dimension - 1) << " and "
		          << top_dimension << "):" << std::endl;
		for (int i = std::max(0, min_dimension - 1); i <= top_dimension; i++)
			outstream << number_of_cells[i] << (i < top_dimension ? " " : "");
		outstream << std::endl;

		index_t cell_euler_characteristic = 0;
		for (int i = 0; i <= top_dimension; i++)
			cell_euler_characteristic += index_t((i % 2 == 1 ? -1 : 1) * number_of_cells[i]);

		bool computed_full_homology = min_dimension == 0 && max_dimension == std::numeric_limits<unsigned short>::max();
		if (computed_full_homology) {
			outstream << "# Euler characteristic:" << std::endl;
			outstream << cell_euler_characteristic << std::endl;
		}
	}

	if (approximate_computation) {
		outstream << "# Skipped columns of the coboundary matrix (in dimensions between "
		          << std::max(0, min_dimension - 1) << " and " << skipped.size() - 1 << "):" << std::endl;
		for (size_t idx = std::max(0, min_dimension - 1); idx < skipped.size(); idx++) {
			outstream << skipped[idx] << (idx < betti.size() ? " " : "");
		}
		outstream << std::endl;
	}

	outstream << "# Betti numbers (between " << min_dimension << " and " << (betti.size() - 1) << "):" << std::endl;
	for (size_t idx = min_dimension; idx < betti.size(); idx++) {
		outstream << betti[idx] << (idx < betti.size() ? " " : "");
	}

	outstream << std::endl;
}